

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qwidgetwindow.cpp
# Opt level: O1

void __thiscall QWidgetWindow::QWidgetWindow(QWidgetWindow *this,QWidget *widget)

{
  char cVar1;
  bool bVar2;
  QWindowPrivate *this_00;
  Data *pDVar3;
  undefined4 *puVar4;
  QWidget *w;
  long in_FS_OFFSET;
  Connection local_68;
  code *local_60;
  ImplFn local_58;
  QObject local_50 [8];
  SurfaceType type;
  uint uStack_44;
  undefined8 local_40;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  this_00 = (QWindowPrivate *)operator_new(0x180);
  pDVar3 = (Data *)0x0;
  memset(this_00,0,0x180);
  QWindowPrivate::QWindowPrivate(this_00,QObjectPrivateVersion);
  *(undefined ***)this_00 = &PTR__QWindowPrivate_007f6388;
  QWindow::QWindow(&this->super_QWindow,this_00,(QWindow *)0x0);
  *(undefined ***)this = &PTR_metaObject_007f61c8;
  *(undefined ***)&this->field_0x10 = &PTR__QWidgetWindow_007f6300;
  if (widget != (QWidget *)0x0) {
    pDVar3 = (Data *)QtSharedPointer::ExternalRefCountData::getAndRef(&widget->super_QObject);
  }
  (this->m_widget).wp.d = pDVar3;
  (this->m_widget).wp.value = &widget->super_QObject;
  (this->m_implicit_mouse_grabber).wp.d = (Data *)0x0;
  (this->m_implicit_mouse_grabber).wp.value = (QObject *)0x0;
  (this->m_dragTarget).wp.d = (Data *)0x0;
  (this->m_dragTarget).wp.value = (QObject *)0x0;
  updateObjectName(this);
  cVar1 = QCoreApplication::testAttribute(AA_ForceRasterWidgets);
  if (cVar1 == '\0') {
    _type = (code *)((ulong)uStack_44 << 0x20);
    pDVar3 = (this->m_widget).wp.d;
    if ((pDVar3 == (Data *)0x0) || (*(int *)(pDVar3 + 4) == 0)) {
      w = (QWidget *)0x0;
    }
    else {
      w = (QWidget *)(this->m_widget).wp.value;
    }
    bVar2 = q_evaluateRhiConfig(w,(QPlatformBackingStoreRhiConfig *)0x0,&type);
    if (bVar2) {
      QWindow::setSurfaceType((SurfaceType)this);
    }
  }
  local_60 = updateObjectName;
  local_58 = (ImplFn)0x0;
  _type = QObject::objectNameChanged;
  local_40 = 0;
  puVar4 = (undefined4 *)operator_new(0x20);
  *puVar4 = 1;
  *(code **)(puVar4 + 2) =
       QtPrivate::QCallableObject<void_(QWidgetWindow::*)(),_QtPrivate::List<>,_void>::impl;
  *(code **)(puVar4 + 4) = updateObjectName;
  *(undefined8 *)(puVar4 + 6) = 0;
  QObject::connectImpl
            (local_50,(void **)widget,(QObject *)&type,(void **)this,(QSlotObjectBase *)&local_60,
             (ConnectionType)puVar4,(int *)0x0,(QMetaObject *)0x0);
  QMetaObject::Connection::~Connection((Connection *)local_50);
  local_60 = handleScreenChange;
  local_58 = (ImplFn)0x0;
  _type = QWindow::screenChanged;
  local_40 = 0;
  puVar4 = (undefined4 *)operator_new(0x20);
  *puVar4 = 1;
  *(code **)(puVar4 + 2) =
       QtPrivate::QCallableObject<void_(QWidgetWindow::*)(),_QtPrivate::List<>,_void>::impl;
  *(code **)(puVar4 + 4) = handleScreenChange;
  *(undefined8 *)(puVar4 + 6) = 0;
  QObject::connectImpl
            ((QObject *)&local_68,(void **)this,(QObject *)&type,(void **)this,
             (QSlotObjectBase *)&local_60,(ConnectionType)puVar4,(int *)0x0,(QMetaObject *)0x0);
  QMetaObject::Connection::~Connection(&local_68);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

QWidgetWindow::QWidgetWindow(QWidget *widget)
    : QWindow(*new QWidgetWindowPrivate(), nullptr)
    , m_widget(widget)
{
    updateObjectName();
    if (!QCoreApplication::testAttribute(Qt::AA_ForceRasterWidgets)) {
        QSurface::SurfaceType type = QSurface::RasterSurface;
        if (q_evaluateRhiConfig(m_widget, nullptr, &type))
            setSurfaceType(type);
    }

    connect(widget, &QObject::objectNameChanged, this, &QWidgetWindow::updateObjectName);
    connect(this, &QWidgetWindow::screenChanged, this, &QWidgetWindow::handleScreenChange);
}